

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

Value * __thiscall
GlobOpt::OptDst(GlobOpt *this,Instr **pInstr,Value *dstVal,Value *src1Val,Value *src2Val,
               Value *dstIndirIndexVal,Value *src1IndirIndexVal)

{
  OpCode OVar1;
  Opnd *this_00;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  BailOutKind BVar5;
  SymOpnd *this_01;
  PropertySymOpnd *opnd;
  IndirOpnd *pIVar6;
  undefined4 *puVar7;
  RegOpnd *pRVar8;
  StackSym *this_02;
  RegOpnd *this_03;
  StackSym *this_04;
  Value *pVVar9;
  Instr *pIVar10;
  BailOutKind bailOutKind;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_42;
  Value *pVStack_40;
  ValueType baseValueType;
  
  this_00 = (*pInstr)->m_dst;
  pVStack_40 = dstVal;
  if (this_00 == (Opnd *)0x0) {
    ProcessKills(this,*pInstr);
    goto LAB_00428315;
  }
  bVar3 = IR::Opnd::IsSymOpnd(this_00);
  if (bVar3) {
    this_01 = IR::Opnd::AsSymOpnd(this_00);
    bVar3 = IR::SymOpnd::IsPropertySymOpnd(this_01);
    if (bVar3) {
      pIVar10 = *pInstr;
      opnd = IR::Opnd::AsPropertySymOpnd(this_00);
      FinishOptPropOp(this,pIVar10,opnd,(BasicBlock *)0x0,false,(bool *)0x0,(bool *)0x0);
    }
  }
  bVar3 = IR::Opnd::IsIndirOpnd(this_00);
  if ((bVar3) && (this->prePassLoop == (Loop *)0x0)) {
    pIVar6 = IR::Opnd::AsIndirOpnd(this_00);
    local_42 = (pIVar6->m_baseOpnd->super_Opnd).m_valueType.field_0;
    bVar3 = ValueType::IsLikelyNativeArray((ValueType *)&local_42.field_0);
    if ((bVar3) && (pIVar10 = *pInstr, pIVar10->m_src1->m_type == TyVar)) {
      if (pIVar10->m_opcode == StElemC) {
        bVar3 = ValueType::IsLikelyNativeArray((ValueType *)&local_42.field_0);
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0xbf2,"(baseValueType.IsLikelyNativeArray())",
                             "baseValueType.IsLikelyNativeArray()");
          if (!bVar3) goto LAB_00428456;
          *puVar7 = 0;
        }
        if (((*pInstr)->field_0x38 & 0x10) != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0xbf3,"(!instr->HasBailOutInfo())","!instr->HasBailOutInfo()");
          if (!bVar3) goto LAB_00428456;
          *puVar7 = 0;
        }
        GenerateBailAtOperation(this,pInstr,BailOutConventionalNativeArrayAccessOnly);
      }
      else if ((pIVar10->field_0x38 & 0x10) != 0) {
        BVar5 = IR::Instr::GetBailOutKind(pIVar10);
        bailOutKind = BVar5 - BailOutOnArrayAccessHelperCall;
        if ((BVar5 >> 0x11 & 1) == 0) {
          bailOutKind = BVar5;
        }
        if ((bailOutKind == BailOutInvalid) || (bailOutKind == BailOutOnImplicitCallsPreOp)) {
          IR::Instr::ClearBailOutInfo(*pInstr);
        }
        else {
          IR::Instr::SetBailOutKind(*pInstr,bailOutKind);
        }
      }
    }
  }
  ProcessKills(this,*pInstr);
  if (pVStack_40 == (Value *)0x0) {
    pVStack_40 = ValueNumberDst(this,pInstr,src1Val,src2Val);
  }
  if (this->prePassLoop == (Loop *)0x0) {
    if (pVStack_40 != (Value *)0x0) {
      IR::Opnd::SetValueType
                (this_00,(ValueType)
                         *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                          &(pVStack_40->valueInfo->super_ValueType).field_0.field_0);
      if ((this->currentBlock->loop != (Loop *)0x0) && (this->prePassLoop == (Loop *)0x0)) {
        OVar1 = (*pInstr)->m_opcode;
        if ((OVar1 == Ld_I4) || (OVar1 == Ld_A)) {
          bVar3 = IR::Opnd::IsRegOpnd((*pInstr)->m_src1);
          if (bVar3) {
            bVar3 = Func::IsJitInDebugMode(this->func);
            if (!bVar3) {
              pRVar8 = IR::Opnd::AsRegOpnd((*pInstr)->m_src1);
              this_02 = pRVar8->m_sym;
              if ((this_02->field_0x1a & 1) != 0) {
                this_02 = StackSym::GetVarEquivSym(this_02,(Func *)0x0);
                if (this_02 == (StackSym *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
                  *puVar7 = 1;
                  bVar3 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                     ,0xc3e,"(srcVarSym)","srcVarSym");
                  if (!bVar3) {
LAB_00428456:
                    pcVar2 = (code *)invalidInstructionException();
                    (*pcVar2)();
                  }
                  *puVar7 = 0;
                  this_02 = (StackSym *)0x0;
                }
              }
              if ((StackSym *)pVStack_40->valueInfo->symStore == this_02) {
                this_03 = IR::Opnd::AsRegOpnd(this_00);
                this_04 = this_03->m_sym;
                if ((this_04->field_0x1a & 1) != 0) {
                  this_04 = StackSym::GetVarEquivSym(this_04,(Func *)0x0);
                  if (this_04 == (StackSym *)0x0) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
                    *puVar7 = 1;
                    Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0xc4a,"(dstVarSym)","dstVarSym");
                    pcVar2 = (code *)invalidInstructionException();
                    (*pcVar2)();
                  }
                }
                BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                                  ((this->currentBlock->loop->regAlloc).liveOnBackEdgeSyms,
                                   (this_04->super_Sym).m_id);
                if (BVar4 != '\0') {
                  pVVar9 = GlobOptBlockData::FindValue
                                     (&this->currentBlock->globOptData,&this_02->super_Sym);
                  if (pVVar9->valueNumber == pVStack_40->valueNumber) {
                    if (((pRVar8->super_Opnd).field_0xb & 4) == 0) {
                      pIVar10 = IR::Instr::GetPrevRealInstrOrLabel(*pInstr);
                      if (pIVar10->m_dst != (Opnd *)0x0) {
                        bVar3 = IR::RegOpnd::IsEqualInternal(pRVar8,pIVar10->m_dst);
                        if (bVar3) {
                          if (pIVar10->m_src1 != (Opnd *)0x0) {
                            bVar3 = IR::Opnd::IsEqual(&this_03->super_Opnd,pIVar10->m_src1);
                            if (bVar3) goto LAB_0042843d;
                          }
                          if (pIVar10->m_src2 != (Opnd *)0x0) {
                            bVar3 = IR::Opnd::IsEqual(&this_03->super_Opnd,pIVar10->m_src2);
                            if (bVar3) goto LAB_0042843d;
                          }
                        }
                      }
                    }
                    else {
LAB_0042843d:
                      SetSymStoreDirect(this,pVStack_40->valueInfo,&this_04->super_Sym);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    bVar3 = IR::Opnd::IsRegOpnd(this_00);
    if (bVar3) {
      pRVar8 = IR::Opnd::AsRegOpnd(this_00);
      BVSparse<Memory::JitArenaAllocator>::Set
                (this->rootLoopPrePass->symsDefInLoop,(pRVar8->m_sym->super_Sym).m_id);
    }
  }
  ValueNumberObjectType(this,this_00,*pInstr);
LAB_00428315:
  pVVar9 = pVStack_40;
  CSEAddInstr(this,this->currentBlock,*pInstr,pVStack_40,src1Val,src2Val,dstIndirIndexVal,
              src1IndirIndexVal);
  return pVVar9;
}

Assistant:

Value*
GlobOpt::OptDst(
    IR::Instr ** pInstr,
    Value *dstVal,
    Value *src1Val,
    Value *src2Val,
    Value *dstIndirIndexVal,
    Value *src1IndirIndexVal)
{
    IR::Instr *&instr = *pInstr;
    IR::Opnd *opnd = instr->GetDst();

    if (opnd)
    {
        if (opnd->IsSymOpnd() && opnd->AsSymOpnd()->IsPropertySymOpnd())
        {
            this->FinishOptPropOp(instr, opnd->AsPropertySymOpnd());
        }

        if (opnd->IsIndirOpnd() && !this->IsLoopPrePass())
        {
            IR::RegOpnd *baseOpnd = opnd->AsIndirOpnd()->GetBaseOpnd();
            const ValueType baseValueType(baseOpnd->GetValueType());
            if ((
                    baseValueType.IsLikelyNativeArray() ||
                #ifdef _M_IX86
                    (
                        !AutoSystemInfo::Data.SSE2Available() &&
                        baseValueType.IsLikelyObject() &&
                        (
                            baseValueType.GetObjectType() == ObjectType::Float32Array ||
                            baseValueType.GetObjectType() == ObjectType::Float64Array
                        )
                    )
                #else
                    false
                #endif
                ) &&
                instr->GetSrc1()->IsVar())
            {
                if(instr->m_opcode == Js::OpCode::StElemC)
                {
                    // StElemC has different code that handles native array conversion or missing value stores. Add a bailout
                    // for those cases.
                    Assert(baseValueType.IsLikelyNativeArray());
                    Assert(!instr->HasBailOutInfo());
                    GenerateBailAtOperation(&instr, IR::BailOutConventionalNativeArrayAccessOnly);
                }
                else if(instr->HasBailOutInfo())
                {
                    // The lowerer is not going to generate a fast path for this case. Remove any bailouts that require the fast
                    // path. Note that the removed bailouts should not be necessary for correctness. Bailout on native array
                    // conversion will be handled automatically as normal.
                    IR::BailOutKind bailOutKind = instr->GetBailOutKind();
                    if(bailOutKind & IR::BailOutOnArrayAccessHelperCall)
                    {
                        bailOutKind -= IR::BailOutOnArrayAccessHelperCall;
                    }
                    if(bailOutKind == IR::BailOutOnImplicitCallsPreOp)
                    {
                        bailOutKind -= IR::BailOutOnImplicitCallsPreOp;
                    }
                    if(bailOutKind)
                    {
                        instr->SetBailOutKind(bailOutKind);
                    }
                    else
                    {
                        instr->ClearBailOutInfo();
                    }
                }
            }
        }
    }

    this->ProcessKills(instr);

    if (opnd)
    {
        if (dstVal == nullptr)
        {
            dstVal = ValueNumberDst(pInstr, src1Val, src2Val);
        }
        if (this->IsLoopPrePass())
        {
            // Keep track of symbols defined in the loop.
            if (opnd->IsRegOpnd())
            {
                StackSym *symDst = opnd->AsRegOpnd()->m_sym;
                rootLoopPrePass->symsDefInLoop->Set(symDst->m_id);
            }
        }
        else if (dstVal)
        {
            opnd->SetValueType(dstVal->GetValueInfo()->Type());
            if (currentBlock->loop &&
                !IsLoopPrePass() &&
                (instr->m_opcode == Js::OpCode::Ld_A || instr->m_opcode == Js::OpCode::Ld_I4) &&
                instr->GetSrc1()->IsRegOpnd() &&
                !func->IsJitInDebugMode())
            {
                // Look for the following patterns:
                //
                // Pattern 1:
                //     s1[liveOnBackEdge] = s3[dead]
                //
                // Pattern 2:
                //     s3 = operation(s1[liveOnBackEdge], s2)
                //     s1[liveOnBackEdge] = s3
                //
                // In both patterns, s1 and s3 have the same value by the end. Prefer to use s1 as the sym store instead of s3
                // since s1 is live on back-edge, as otherwise, their lifetimes overlap, requiring two registers to hold the
                // value instead of one.
                do
                {
                    IR::RegOpnd *const src = instr->GetSrc1()->AsRegOpnd();
                    StackSym *srcVarSym = src->m_sym;
                    if(srcVarSym->IsTypeSpec())
                    {
                        srcVarSym = srcVarSym->GetVarEquivSym(nullptr);
                        Assert(srcVarSym);
                    }
                    if(dstVal->GetValueInfo()->GetSymStore() != srcVarSym)
                    {
                        break;
                    }

                    IR::RegOpnd *const dst = opnd->AsRegOpnd();
                    StackSym *dstVarSym = dst->m_sym;
                    if(dstVarSym->IsTypeSpec())
                    {
                        dstVarSym = dstVarSym->GetVarEquivSym(nullptr);
                        Assert(dstVarSym);
                    }
                    if(!currentBlock->loop->regAlloc.liveOnBackEdgeSyms->Test(dstVarSym->m_id))
                    {
                        break;
                    }

                    Value *const srcValue = CurrentBlockData()->FindValue(srcVarSym);
                    if(srcValue->GetValueNumber() != dstVal->GetValueNumber())
                    {
                        break;
                    }

                    if(!src->GetIsDead())
                    {
                        IR::Instr *const prevInstr = instr->GetPrevRealInstrOrLabel();
                        IR::Opnd *const prevDst = prevInstr->GetDst();
                        if(!prevDst ||
                            !src->IsEqualInternal(prevDst) ||
                            !(
                                (prevInstr->GetSrc1() && dst->IsEqual(prevInstr->GetSrc1())) ||
                                (prevInstr->GetSrc2() && dst->IsEqual(prevInstr->GetSrc2()))
                            ))
                        {
                            break;
                        }
                    }

                    this->SetSymStoreDirect(dstVal->GetValueInfo(), dstVarSym);
                } while(false);
            }
        }

        this->ValueNumberObjectType(opnd, instr);
    }

    this->CSEAddInstr(this->currentBlock, *pInstr, dstVal, src1Val, src2Val, dstIndirIndexVal, src1IndirIndexVal);

    return dstVal;
}